

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O3

size_t rtosc_message_ring_length(ring_t *ring)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  uint uVar6;
  char *pcVar7;
  ring_t *prVar8;
  uint uVar9;
  ring_t *prVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  
  uVar2 = ring->len;
  if (uVar2 == 0) {
    uVar4 = ring[1].len;
    if ((uVar4 == 0) || (*ring[1].data != '#')) goto LAB_00112e0d;
LAB_00112cfa:
    uVar3 = 1 - uVar2;
    if (uVar4 <= uVar3) goto LAB_00112e0d;
    pcVar7 = ring[1].data;
  }
  else {
    pcVar7 = ring->data;
    if (*pcVar7 != '#') goto LAB_00112e0d;
    uVar3 = 1;
    if (uVar2 == 1) {
      uVar4 = ring[1].len;
      goto LAB_00112cfa;
    }
  }
  if (pcVar7[uVar3] == 'b') {
    uVar4 = 2;
    prVar8 = ring;
    if (uVar2 < 3) {
      uVar4 = 2 - uVar2;
      if (ring[1].len <= uVar4) goto LAB_00112e0d;
      prVar8 = ring + 1;
    }
    if (prVar8->data[uVar4] != 'u') goto LAB_00112e0d;
    uVar4 = 3;
    prVar8 = ring;
    if (uVar2 < 4) {
      uVar4 = 3 - uVar2;
      if (ring[1].len <= uVar4) goto LAB_00112e0d;
      prVar8 = ring + 1;
    }
    if (prVar8->data[uVar4] != 'n') goto LAB_00112e0d;
    uVar4 = 4;
    prVar8 = ring;
    if (uVar2 < 5) {
      uVar4 = 4 - uVar2;
      if (ring[1].len <= uVar4) goto LAB_00112e0d;
      prVar8 = ring + 1;
    }
    if (prVar8->data[uVar4] != 'd') goto LAB_00112e0d;
    uVar4 = 5;
    prVar8 = ring;
    if (uVar2 < 6) {
      uVar4 = 5 - uVar2;
      if (ring[1].len <= uVar4) goto LAB_00112e0d;
      prVar8 = ring + 1;
    }
    if (prVar8->data[uVar4] != 'l') goto LAB_00112e0d;
    uVar4 = 6;
    prVar8 = ring;
    if (uVar2 < 7) {
      uVar4 = 6 - uVar2;
      if (ring[1].len <= uVar4) goto LAB_00112e0d;
      prVar8 = ring + 1;
    }
    if (prVar8->data[uVar4] != 'e') goto LAB_00112e0d;
    uVar4 = 7;
    prVar8 = ring;
    if (uVar2 < 8) {
      uVar4 = 7 - uVar2;
      if (ring[1].len <= uVar4) goto LAB_0011313d;
      prVar8 = ring + 1;
    }
    if (prVar8->data[uVar4] == '\0') {
LAB_0011313d:
      sVar5 = bundle_ring_length(ring);
      return sVar5;
    }
  }
LAB_00112e0d:
  prVar8 = ring + 1;
  iVar15 = -3;
  uVar14 = 0;
  do {
    uVar6 = uVar14;
    iVar13 = iVar15;
    uVar3 = (ulong)(iVar13 + 3);
    uVar4 = uVar3;
    prVar10 = ring;
    if ((uVar2 <= uVar3) && (uVar4 = uVar3 - uVar2, prVar10 = prVar8, ring[1].len <= uVar3 - uVar2))
    break;
    iVar15 = iVar13 + 1;
    uVar14 = uVar6 + 3;
  } while (prVar10->data[uVar4] != '\0');
  uVar14 = 0;
LAB_00112e50:
  uVar4 = (ulong)(iVar13 + 4);
  uVar3 = uVar4 - uVar2;
  if (uVar4 < uVar2) {
    prVar10 = ring;
    if ((ring->data[uVar4] != '\0') || (2 < uVar14)) goto LAB_00112eab;
  }
  else if (((uVar3 < ring[1].len) && (prVar8->data[uVar3] != '\0')) || (2 < uVar14)) {
    prVar10 = prVar8;
    uVar4 = uVar3;
    if (ring[1].len <= uVar3) {
      return 0;
    }
LAB_00112eab:
    if (prVar10->data[uVar4] != ',') {
      return 0;
    }
    uVar3 = (ulong)(iVar13 + 5);
    uVar4 = uVar3;
    iVar15 = iVar13 + 9;
    uVar14 = 1;
    do {
      uVar16 = uVar14;
      iVar11 = iVar15;
      prVar10 = ring;
      uVar19 = uVar4;
      if ((uVar2 <= uVar4) &&
         (prVar10 = prVar8, uVar19 = uVar4 - uVar2, ring[1].len <= uVar4 - uVar2)) break;
      uVar4 = (ulong)((int)uVar4 + 1);
      iVar15 = iVar11 + 1;
      uVar14 = uVar16 + 1;
    } while (prVar10->data[uVar19] != '\0');
    uVar14 = iVar11 - (uVar16 & 3);
    iVar15 = 0;
    do {
      if (uVar3 < uVar2) {
        bVar1 = ring->data[uVar3];
      }
      else {
        if (ring[1].len <= uVar3 - uVar2) goto LAB_00112f6f;
        bVar1 = prVar8->data[uVar3 - uVar2];
      }
      if (bVar1 == 0) goto LAB_00112f6f;
      if ((0x2e < bVar1 - 0x46) ||
         (iVar11 = 1, (0x708d70002000U >> ((ulong)(bVar1 - 0x46) & 0x3f) & 1) == 0)) {
        iVar11 = 0;
      }
      iVar15 = iVar15 + iVar11;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while( true );
  }
  uVar14 = uVar14 + 1;
  uVar6 = (uint)(byte)((char)uVar6 + 3);
  iVar13 = iVar13 + 1;
  goto LAB_00112e50;
LAB_00112f6f:
  if (iVar15 != 0) {
    uVar16 = iVar13 + 5;
    do {
      uVar3 = (ulong)uVar16;
      prVar10 = ring;
      uVar4 = uVar3;
      if ((uVar2 <= uVar3) &&
         (prVar10 = prVar8, uVar4 = uVar3 - uVar2, ring[1].len <= uVar3 - uVar2))
      goto switchD_00112fbb_caseD_65;
      switch(prVar10->data[uVar4]) {
      case 'b':
        uVar3 = (ulong)uVar14;
        uVar4 = uVar3;
        prVar10 = ring;
        if ((uVar3 < uVar2) ||
           (uVar9 = 0, uVar4 = uVar3 - uVar2, prVar10 = prVar8, uVar3 - uVar2 < ring[1].len)) {
          uVar9 = (uint)(byte)prVar10->data[uVar4] << 0x18;
        }
        uVar3 = (ulong)(uVar14 + 1);
        uVar4 = uVar3;
        prVar10 = ring;
        if ((uVar3 < uVar2) ||
           (uVar18 = 0, uVar4 = uVar3 - uVar2, prVar10 = prVar8, uVar3 - uVar2 < ring[1].len)) {
          uVar18 = (uint)(byte)prVar10->data[uVar4] << 0x10;
        }
        uVar3 = (ulong)(uVar14 + 2);
        prVar10 = ring;
        uVar4 = uVar3;
        if ((uVar3 < uVar2) ||
           (uVar17 = 0, prVar10 = prVar8, uVar4 = uVar3 - uVar2, uVar3 - uVar2 < ring[1].len)) {
          uVar17 = (uint)(byte)prVar10->data[uVar4] << 8;
        }
        uVar3 = (ulong)(uVar14 + 3);
        uVar4 = uVar3;
        prVar10 = ring;
        if ((uVar3 < uVar2) ||
           (uVar20 = 0, uVar4 = uVar3 - uVar2, prVar10 = prVar8, uVar3 - uVar2 < ring[1].len)) {
          uVar20 = (uint)(byte)prVar10->data[uVar4];
        }
        uVar9 = (uVar18 | uVar9 | uVar17 | uVar20) + uVar14 + 4;
        uVar18 = (uVar17 - iVar13) + uVar14 + uVar20 & 3;
        uVar14 = (uVar9 - uVar18) + 4;
        if (uVar18 == 0) {
          uVar14 = uVar9;
        }
        iVar15 = iVar15 + -1;
        break;
      case 'c':
      case 'f':
      case 'i':
      case 'm':
      case 'r':
        uVar14 = uVar14 + 4;
        goto LAB_00112fc8;
      case 'd':
      case 'h':
      case 't':
        uVar14 = uVar14 + 8;
LAB_00112fc8:
        iVar15 = iVar15 + -1;
        break;
      case 'e':
      case 'g':
      case 'j':
      case 'k':
      case 'l':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
        break;
      case 's':
switchD_00112fbb_caseD_73:
        uVar9 = uVar6 + uVar14;
        iVar11 = uVar14 + 5;
        do {
          iVar12 = iVar11;
          uVar18 = uVar9;
          uVar14 = uVar14 + 1;
          uVar3 = (ulong)uVar14;
          prVar10 = ring;
          uVar4 = uVar3;
          if ((uVar2 <= uVar3) &&
             (prVar10 = prVar8, uVar4 = uVar3 - uVar2, ring[1].len <= uVar3 - uVar2)) break;
          uVar9 = uVar18 + 1;
          iVar11 = iVar12 + 1;
        } while (prVar10->data[uVar4] != '\0');
        uVar14 = iVar12 - (uVar18 & 3);
        iVar15 = iVar15 + -1;
        break;
      default:
        if (prVar10->data[uVar4] == 'S') goto switchD_00112fbb_caseD_73;
      }
switchD_00112fbb_caseD_65:
      uVar16 = uVar16 + 1;
    } while (iVar15 != 0);
  }
  if ((ulong)uVar14 <= uVar2 + ring[1].len) {
    return (ulong)uVar14;
  }
  return 0;
}

Assistant:

size_t rtosc_message_ring_length(ring_t *ring)
{
    //Check if the message is a bundle
    if(deref(0,ring) == '#' &&
            deref(1,ring) == 'b' &&
            deref(2,ring) == 'u' &&
            deref(3,ring) == 'n' &&
            deref(4,ring) == 'd' &&
            deref(5,ring) == 'l' &&
            deref(6,ring) == 'e' &&
            deref(7,ring) == '\0')
        return bundle_ring_length(ring);

    //Proceed for normal messages
    //Consume path
    unsigned pos = 0;
    while(deref(pos++,ring));
    pos--;

    //Travel through the null word end [1..4] bytes
    for(int i=0; i<4; ++i)
        if(deref(++pos, ring))
            break;

    if(deref(pos, ring) != ',')
        return 0;

    unsigned aligned_pos = pos;
    int arguments = pos+1;
    while(deref(++pos,ring));
    pos += 4-(pos-aligned_pos)%4;

    unsigned toparse = 0;
    {
        int arg = arguments-1;
        while(deref(++arg,ring))
            toparse += has_reserved(deref(arg,ring));
    }

    //Take care of varargs
    while(toparse)
    {
        char arg = deref(arguments++,ring);
        assert(arg);
        uint32_t i;
        switch(arg) {
            case 'h':
            case 't':
            case 'd':
                pos += 8;
                --toparse;
                break;
            case 'm':
            case 'r':
            case 'c':
            case 'f':
            case 'i':
                pos += 4;
                --toparse;
                break;
            case 'S':
            case 's':
                while(deref(++pos,ring));
                pos += 4-(pos-aligned_pos)%4;
                --toparse;
                break;
            case 'b':
                i = 0;
                i |= (deref(pos++,ring) << 24);
                i |= (deref(pos++,ring) << 16);
                i |= (deref(pos++,ring) << 8);
                i |= (deref(pos++,ring));
                pos += i;
                if((pos-aligned_pos)%4)
                    pos += 4-(pos-aligned_pos)%4;
                --toparse;
                break;
            default:
                ;
        }
    }


    return pos <= (ring[0].len+ring[1].len) ? pos : 0;
}